

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator_wrapper.cc
# Opt level: O0

int WebRtc_InitDelayEstimatorFarend(void *handle)

{
  DelayEstimatorFarend *self;
  void *handle_local;
  
  if (handle == (void *)0x0) {
    handle_local._4_4_ = -1;
  }
  else {
    WebRtc_InitBinaryDelayEstimatorFarend(*(BinaryDelayEstimatorFarend **)((long)handle + 0x10));
    memset(*handle,0,(long)*(int *)((long)handle + 0xc) << 2);
    *(undefined4 *)((long)handle + 8) = 0;
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int WebRtc_InitDelayEstimatorFarend(void* handle) {
  DelayEstimatorFarend* self = (DelayEstimatorFarend*) handle;

  if (self == NULL) {
    return -1;
  }

  // Initialize far-end part of binary delay estimator.
  WebRtc_InitBinaryDelayEstimatorFarend(self->binary_farend);

  // Set averaged far and near end spectra to zero.
  memset(self->mean_far_spectrum, 0,
         sizeof(SpectrumType) * self->spectrum_size);
  // Reset initialization indicators.
  self->far_spectrum_initialized = 0;

  return 0;
}